

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O2

void __thiscall
wallet::CWallet::WalletLogPrintf<std::__cxx11::string,char_const*>
          (CWallet *this,char *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters,
          char *parameters_1)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  Logger *pLVar3;
  char **in_R9;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  allocator<char> local_131;
  char *parameters_local;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [4];
  string local_60;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,fmt,&local_131);
  std::operator+(local_e0,"%s ",&local_100);
  GetDisplayName_abi_cxx11_(&local_120,this);
  pLVar3 = LogInstance();
  bVar2 = BCLog::Logger::Enabled(pLVar3);
  if (bVar2) {
    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
    log_msg._M_string_length = 0;
    log_msg.field_2._M_local_buf[0] = '\0';
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,char_const*>
              (&local_60,(tinyformat *)local_e0[0]._M_dataplus._M_p,(char *)&local_120,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)parameters_1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &parameters_local,in_R9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&log_msg,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    pLVar3 = LogInstance();
    local_60._M_dataplus._M_p = (pointer)0x58;
    local_60._M_string_length = 0x6e4fa9;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h";
    source_file._M_len = 0x58;
    str._M_str = log_msg._M_dataplus._M_p;
    str._M_len = log_msg._M_string_length;
    logging_function._M_str = "WalletLogPrintf";
    logging_function._M_len = 0xf;
    BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x3a4,ALL,Info);
    std::__cxx11::string::~string((string *)&log_msg);
  }
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WalletLogPrintf(const char* fmt, Params... parameters) const
    {
        LogPrintf(("%s " + std::string{fmt}).c_str(), GetDisplayName(), parameters...);
    }